

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Type __thiscall wasm::TranslateToFuzzReader::getSingleConcreteType(TranslateToFuzzReader *this)

{
  WeightedOption rest_1;
  WeightedOption rest_2;
  WeightedOption weightedOption;
  WeightedOption rest;
  WeightedOption weightedOption_00;
  bool bVar1;
  value_type *pvVar2;
  FeatureOptions<wasm::Type> *pFVar3;
  HeapType local_1d8;
  Type local_1d0;
  HeapType local_1c8;
  Type local_1c0;
  FeatureSet local_1b4;
  HeapType local_1b0;
  Type local_1a8;
  HeapType local_1a0;
  Type local_198;
  HeapType local_190;
  Type local_188;
  HeapType local_180;
  Type local_178;
  HeapType local_170;
  Type local_168;
  HeapType local_160;
  Type local_158;
  HeapType local_150;
  Type local_148;
  HeapType local_140;
  Type local_138;
  FeatureSet local_12c;
  HeapType local_128;
  Type local_120;
  FeatureSet local_114;
  HeapType local_110;
  Type local_108;
  HeapType local_100;
  Type local_f8;
  FeatureSet local_ec;
  Type local_e8;
  undefined8 local_e0;
  FeatureSet local_d4;
  Type local_d0;
  undefined8 uStack_c8;
  Type local_c0;
  size_t sStack_b8;
  Type local_b0;
  size_t local_a8;
  Type local_a0;
  size_t local_98;
  FeatureSet local_7c;
  FeatureOptions<wasm::Type> local_78;
  uintptr_t local_40;
  Nullability local_34;
  HeapType HStack_30;
  Nullability nullability;
  value_type heapType;
  TranslateToFuzzReader *this_local;
  
  heapType.id = (uintptr_t)this;
  bVar1 = FeatureSet::hasReferenceTypes((FeatureSet *)(this->wasm + 0x178));
  if (((!bVar1) ||
      (bVar1 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::empty
                         (&this->interestingHeapTypes), bVar1)) || (bVar1 = oneIn(this,3), !bVar1))
  {
    local_78.options._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    local_78.options._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_78.options._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_78.options._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    local_78.options._M_t._M_impl._0_8_ = 0;
    local_78.options._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_78.options._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    Random::FeatureOptions<wasm::Type>::FeatureOptions(&local_78);
    FeatureSet::FeatureSet(&local_7c,0);
    Type::Type(&local_a0,i32);
    local_98 = 4;
    Type::Type(&local_b0,i64);
    local_a8 = 4;
    Type::Type(&local_c0,f32);
    sStack_b8 = 4;
    Type::Type(&local_d0,f64);
    uStack_c8 = 4;
    weightedOption_00.weight = local_98;
    weightedOption_00.option.id = local_a0.id;
    rest.weight = local_a8;
    rest.option.id = local_b0.id;
    rest_1.weight = sStack_b8;
    rest_1.option.id = local_c0.id;
    rest_2.weight = 4;
    rest_2.option.id = local_d0.id;
    pFVar3 = Random::FeatureOptions<wasm::Type>::
             add<wasm::Random::FeatureOptions<wasm::Type>::WeightedOption,wasm::Random::FeatureOptions<wasm::Type>::WeightedOption,wasm::Random::FeatureOptions<wasm::Type>::WeightedOption>
                       (&local_78,local_7c,weightedOption_00,rest,rest_1,rest_2);
    FeatureSet::FeatureSet(&local_d4,8);
    Type::Type(&local_e8,v128);
    local_e0 = 2;
    weightedOption.weight = 2;
    weightedOption.option.id = local_e8.id;
    pFVar3 = Random::FeatureOptions<wasm::Type>::add<>(pFVar3,local_d4,weightedOption);
    FeatureSet::FeatureSet(&local_ec,0x100);
    HeapType::HeapType(&local_100,func);
    Type::Type(&local_f8,local_100,Nullable,Inexact);
    HeapType::HeapType(&local_110,ext);
    Type::Type(&local_108,local_110,Nullable,Inexact);
    pFVar3 = Random::FeatureOptions<wasm::Type>::add<wasm::Type>(pFVar3,local_ec,local_f8,local_108)
    ;
    FeatureSet::FeatureSet(&local_114,0x40);
    HeapType::HeapType(&local_128,exn);
    Type::Type(&local_120,local_128,Nullable,Inexact);
    pFVar3 = Random::FeatureOptions<wasm::Type>::add<>(pFVar3,local_114,local_120);
    FeatureSet::FeatureSet(&local_12c,0x500);
    HeapType::HeapType(&local_140,any);
    Type::Type(&local_138,local_140,Nullable,Inexact);
    HeapType::HeapType(&local_150,eq);
    Type::Type(&local_148,local_150,Nullable,Inexact);
    HeapType::HeapType(&local_160,eq);
    Type::Type(&local_158,local_160,NonNullable,Inexact);
    HeapType::HeapType(&local_170,i31);
    Type::Type(&local_168,local_170,Nullable,Inexact);
    HeapType::HeapType(&local_180,struct_);
    Type::Type(&local_178,local_180,Nullable,Inexact);
    HeapType::HeapType(&local_190,struct_);
    Type::Type(&local_188,local_190,NonNullable,Inexact);
    HeapType::HeapType(&local_1a0,array);
    Type::Type(&local_198,local_1a0,Nullable,Inexact);
    HeapType::HeapType(&local_1b0,array);
    Type::Type(&local_1a8,local_1b0,NonNullable,Inexact);
    pFVar3 = Random::FeatureOptions<wasm::Type>::
             add<wasm::Type,wasm::Type,wasm::Type,wasm::Type,wasm::Type,wasm::Type,wasm::Type>
                       (pFVar3,local_12c,local_138,local_148,local_158,local_168,local_178,local_188
                        ,local_198,local_1a8);
    FeatureSet::FeatureSet(&local_1b4,0x4000);
    HeapType::HeapType(&local_1c8,string);
    Type::Type(&local_1c0,local_1c8,Nullable,Inexact);
    HeapType::HeapType(&local_1d8,string);
    Type::Type(&local_1d0,local_1d8,NonNullable,Inexact);
    pFVar3 = Random::FeatureOptions<wasm::Type>::add<wasm::Type>
                       (pFVar3,local_1b4,local_1c0,local_1d0);
    this_local = (TranslateToFuzzReader *)pick<wasm::Type>(this,pFVar3);
    Random::FeatureOptions<wasm::Type>::~FeatureOptions(&local_78);
  }
  else {
    pvVar2 = pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                       (this,&this->interestingHeapTypes);
    HStack_30.id = pvVar2->id;
    local_34 = getNullability(this);
    local_40 = HStack_30.id;
    Type::Type((Type *)&this_local,HStack_30,local_34,Inexact);
  }
  return (Type)(uintptr_t)this_local;
}

Assistant:

Type TranslateToFuzzReader::getSingleConcreteType() {
  if (wasm.features.hasReferenceTypes() && !interestingHeapTypes.empty() &&
      oneIn(3)) {
    auto heapType = pick(interestingHeapTypes);
    auto nullability = getNullability();
    return Type(heapType, nullability);
  }
  // Skip (ref func|extern|i31|exn) because there is no way to create them in
  // globals. TODO
  using WeightedOption = FeatureOptions<Type>::WeightedOption;
  return pick(FeatureOptions<Type>()
                .add(FeatureSet::MVP,
                     WeightedOption{Type::i32, VeryImportant},
                     WeightedOption{Type::i64, VeryImportant},
                     WeightedOption{Type::f32, VeryImportant},
                     WeightedOption{Type::f64, VeryImportant})
                .add(FeatureSet::SIMD, WeightedOption{Type::v128, Important})
                .add(FeatureSet::ReferenceTypes,
                     Type(HeapType::func, Nullable),
                     Type(HeapType::ext, Nullable))
                .add(FeatureSet::ExceptionHandling,
                     // Type(HeapType::exn, NonNullable),
                     Type(HeapType::exn, Nullable))
                .add(FeatureSet::ReferenceTypes | FeatureSet::GC,
                     // Type(HeapType::func, NonNullable),
                     // Type(HeapType::ext, NonNullable),
                     Type(HeapType::any, Nullable),
                     // Type(HeapType::any, NonNullable),
                     Type(HeapType::eq, Nullable),
                     Type(HeapType::eq, NonNullable),
                     Type(HeapType::i31, Nullable),
                     // Type(HeapType::i31, NonNullable),
                     Type(HeapType::struct_, Nullable),
                     Type(HeapType::struct_, NonNullable),
                     Type(HeapType::array, Nullable),
                     Type(HeapType::array, NonNullable))
                .add(FeatureSet::Strings,
                     Type(HeapType::string, Nullable),
                     Type(HeapType::string, NonNullable)));
}